

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O0

void __thiscall
duckdb::ParquetReader::ParquetReader
          (ParquetReader *this,ClientContext *context_p,OpenFileInfo *file_p,
          ParquetOptions *parquet_options_p,
          shared_ptr<duckdb::ParquetFileMetadataCache,_true> *metadata_p)

{
  ClientContext *pCVar1;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined8 uVar6;
  NotImplementedException *this_00;
  pointer ppVar7;
  ObjectCache *this_01;
  long lVar8;
  ParquetFileMetadataCache *pPVar9;
  ClientContext *in_RSI;
  undefined8 *in_RDI;
  FileOpenFlags FVar10;
  time_t last_modify_time;
  Value metadata_cache;
  DBConfig *config;
  iterator footer_entry;
  iterator encryption_entry;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  *open_options;
  optional_idx footer_size;
  ParquetOptions *in_stack_fffffffffffffc08;
  ParquetOptions *in_stack_fffffffffffffc10;
  OpenFileInfo *in_stack_fffffffffffffc18;
  OpenFileInfo *in_stack_fffffffffffffc20;
  OpenFileInfo *in_stack_fffffffffffffc28;
  BaseFileReader *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  idx_t in_stack_fffffffffffffc48;
  optional_idx *in_stack_fffffffffffffc50;
  shared_ptr<duckdb::ObjectCacheEntry,_true> *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  undefined6 in_stack_fffffffffffffc90;
  allocator *key;
  shared_ptr<duckdb::ObjectCacheEntry,_true> local_260;
  string local_250 [8];
  ClientContext *in_stack_fffffffffffffdb8;
  ParquetReader *in_stack_fffffffffffffdc0;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true> local_218 [2];
  long local_1f8;
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [32];
  Value local_1a0 [80];
  ObjectCache *local_150;
  idx_t local_148;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  local_140;
  allocator local_131;
  string local_130 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  local_110 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  local_f8;
  allocator local_e9;
  string local_e8 [8];
  EncryptionUtil *in_stack_ffffffffffffff20;
  shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *in_stack_ffffffffffffff28;
  CachingFileHandle *in_stack_ffffffffffffff30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  in_stack_ffffffffffffff38;
  ClientContext *in_stack_ffffffffffffff40;
  optional_idx in_stack_ffffffffffffff48;
  allocator local_a9;
  string local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  OpenFileInfo local_70 [2];
  ClientContext *local_10;
  
  local_10 = in_RSI;
  OpenFileInfo::OpenFileInfo(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  BaseFileReader::BaseFileReader(in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  OpenFileInfo::~OpenFileInfo((OpenFileInfo *)in_stack_fffffffffffffc10);
  *in_RDI = &PTR__ParquetReader_00bffc40;
  duckdb::CachingFileSystem::Get((ClientContext *)(in_RDI + 0x21));
  uVar6 = duckdb::BufferAllocator::Get(local_10);
  in_RDI[0x23] = uVar6;
  shared_ptr<duckdb::ParquetFileMetadataCache,_true>::shared_ptr
            ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)0x69d04b);
  ParquetOptions::ParquetOptions(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>::
  unique_ptr((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
              *)0x69d08f);
  shared_ptr<duckdb::EncryptionUtil,_true>::shared_ptr
            ((shared_ptr<duckdb::EncryptionUtil,_true> *)0x69d0ab);
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
  unique_ptr((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              *)0x69d0c9);
  FVar10.flags = in_RDI + 0x21;
  FVar10._8_8_ = in_RDI + 1;
  local_88 = FileFlags::FILE_FLAGS_READ;
  uStack_80 = _strcmp;
  duckdb::CachingFileSystem::OpenFile(local_70,FVar10);
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
  operator=((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
             *)in_stack_fffffffffffffc10,
            (unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
             *)in_stack_fffffffffffffc08);
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
  ~unique_ptr((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
               *)0x69d149);
  unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
  operator->((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
              *)in_stack_fffffffffffffc10);
  bVar2 = duckdb::CachingFileHandle::CanSeek();
  if ((bVar2 & 1) == 0) {
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,
               "Reading parquet files from a FIFO stream is not supported and cannot be efficiently supported since metadata is located at the end of the file. Write the stream to disk first and read from there instead."
               ,&local_a9);
    duckdb::NotImplementedException::NotImplementedException(this_00,local_a8);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  }
  optional_idx::optional_idx((optional_idx *)&stack0xffffffffffffff48);
  bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::ExtendedOpenFileInfo,_true> *)0x69d33c);
  if (bVar3) {
    in_stack_ffffffffffffff40 =
         (ClientContext *)
         shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->
                   ((shared_ptr<duckdb::ExtendedOpenFileInfo,_true> *)in_stack_fffffffffffffc10);
    shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->
              ((shared_ptr<duckdb::ExtendedOpenFileInfo,_true> *)in_stack_fffffffffffffc10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"encryption_key",&local_e9);
    in_stack_ffffffffffffff38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 *)in_stack_fffffffffffffc08,(key_type *)0x69d3e3);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    local_f8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)in_stack_fffffffffffffc08);
    bVar3 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
                        *)&stack0xffffffffffffff38,&local_f8);
    if (bVar3) {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_false,_true>
                             *)0x69d457);
      duckdb::StringValue::Get_abi_cxx11_(&ppVar7->second);
      make_shared_ptr<duckdb::ParquetEncryptionConfig,std::__cxx11::string_const&>
                (in_stack_fffffffffffffc38);
      shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator=
                ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)in_stack_fffffffffffffc20,
                 (shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)in_stack_fffffffffffffc18);
      shared_ptr<duckdb::ParquetEncryptionConfig,_true>::~shared_ptr
                ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)0x69d4b1);
    }
    shared_ptr<duckdb::ExtendedOpenFileInfo,_true>::operator->
              ((shared_ptr<duckdb::ExtendedOpenFileInfo,_true> *)in_stack_fffffffffffffc10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"footer_size",&local_131);
    local_110[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 *)in_stack_fffffffffffffc08,(key_type *)0x69d56f);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    local_140._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                *)in_stack_fffffffffffffc08);
    bVar3 = std::__detail::operator!=(local_110,&local_140);
    if (bVar3) {
      ppVar7 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_false,_true>
                             *)0x69d5e3);
      duckdb::UBigIntValue::Get(&ppVar7->second);
      optional_idx::optional_idx(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      in_stack_ffffffffffffff48.index = local_148;
    }
  }
  this_01 = (ObjectCache *)duckdb::DBConfig::GetConfig(local_10);
  local_150 = this_01;
  bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::EncryptionUtil,_true> *)0x69d6a8);
  if ((bVar3) && ((*(byte *)(in_RDI + 0x29) & 1) != 0)) {
    shared_ptr<duckdb::EncryptionUtil,_true>::operator=
              ((shared_ptr<duckdb::EncryptionUtil,_true> *)in_stack_fffffffffffffc28,
               (shared_ptr<duckdb::EncryptionUtil,_true> *)in_stack_fffffffffffffc20);
  }
  else {
    make_shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory>();
    shared_ptr<duckdb::EncryptionUtil,_true>::
    operator=<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory,_0>
              ((shared_ptr<duckdb::EncryptionUtil,_true> *)in_stack_fffffffffffffc20,
               (shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory,_true> *)
               in_stack_fffffffffffffc18);
    shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory,_true>::~shared_ptr
              ((shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory,_true> *)0x69d71e)
    ;
  }
  bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                    ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)0x69d753);
  if (bVar3) {
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator=
              ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_fffffffffffffc20,
               (shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_fffffffffffffc18);
    goto LAB_0069dc91;
  }
  duckdb::Value::Value(local_1a0,0);
  pCVar1 = local_10;
  key = &local_1c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"parquet_metadata_cache",key);
  uVar4 = duckdb::ClientContext::TryGetCurrentSetting((string *)pCVar1,(Value *)local_1c0);
  local_1c2 = uVar4;
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  uVar5 = duckdb::Value::GetValue<bool>();
  if ((bool)uVar5) {
    unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
    operator->((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
                *)in_stack_fffffffffffffc10);
    local_1f8 = duckdb::CachingFileHandle::GetLastModifiedTime();
    duckdb::ObjectCache::GetObjectCache(local_10);
    ObjectCache::Get<duckdb::ParquetFileMetadataCache>(this_01,(string *)key);
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator=
              ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_fffffffffffffc20,
               (shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_fffffffffffffc18);
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::~shared_ptr
              ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)0x69da37);
    bVar3 = duckdb::shared_ptr::operator_cast_to_bool
                      ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)0x69da4b);
    if (bVar3) {
      lVar8 = local_1f8 + 10;
      pPVar9 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->
                         ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)
                          in_stack_fffffffffffffc10);
      if (lVar8 < pPVar9->read_time) goto LAB_0069dc57;
    }
    unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
    operator*((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
               *)in_stack_fffffffffffffc10);
    shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::
    shared_ptr<duckdb::ParquetEncryptionConfig,_0>
              ((shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)in_stack_fffffffffffffc10,
               (shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)in_stack_fffffffffffffc08);
    shared_ptr<duckdb::EncryptionUtil,_true>::operator*
              ((shared_ptr<duckdb::EncryptionUtil,_true> *)in_stack_fffffffffffffc10);
    LoadMetadata(in_stack_ffffffffffffff40,(Allocator *)in_stack_ffffffffffffff38._M_cur,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff48);
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator=
              ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_fffffffffffffc20,
               local_218);
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::~shared_ptr
              ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)0x69db70);
    shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::~shared_ptr
              ((shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)0x69db7d);
    duckdb::ObjectCache::GetObjectCache(local_10);
    std::__cxx11::string::string(local_250,(string *)(in_RDI + 1));
    shared_ptr<duckdb::ObjectCacheEntry,_true>::shared_ptr<duckdb::ParquetFileMetadataCache,_0>
              (&local_260,
               (shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_ffffffffffffff48.index
              );
    ObjectCache::Put((ObjectCache *)CONCAT17(uVar4,CONCAT16(uVar5,in_stack_fffffffffffffc90)),
                     in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    shared_ptr<duckdb::ObjectCacheEntry,_true>::~shared_ptr
              ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)0x69dbf3);
    std::__cxx11::string::~string(local_250);
  }
  else {
    unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>::
    operator*((unique_ptr<duckdb::CachingFileHandle,_std::default_delete<duckdb::CachingFileHandle>,_true>
               *)in_stack_fffffffffffffc10);
    shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::
    shared_ptr<duckdb::ParquetEncryptionConfig,_0>
              ((shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)in_stack_fffffffffffffc10,
               (shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)in_stack_fffffffffffffc08);
    shared_ptr<duckdb::EncryptionUtil,_true>::operator*
              ((shared_ptr<duckdb::EncryptionUtil,_true> *)in_stack_fffffffffffffc10);
    LoadMetadata(in_stack_ffffffffffffff40,(Allocator *)in_stack_ffffffffffffff38._M_cur,
                 in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff48);
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator=
              ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_fffffffffffffc20,
               (shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)in_stack_fffffffffffffc18);
    shared_ptr<duckdb::ParquetFileMetadataCache,_true>::~shared_ptr
              ((shared_ptr<duckdb::ParquetFileMetadataCache,_true> *)0x69d907);
    shared_ptr<const_duckdb::ParquetEncryptionConfig,_true>::~shared_ptr
              ((shared_ptr<const_duckdb::ParquetEncryptionConfig,_true> *)0x69d914);
  }
LAB_0069dc57:
  duckdb::Value::~Value(local_1a0);
LAB_0069dc91:
  InitializeSchema(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  return;
}

Assistant:

ParquetReader::ParquetReader(ClientContext &context_p, OpenFileInfo file_p, ParquetOptions parquet_options_p,
                             shared_ptr<ParquetFileMetadataCache> metadata_p)
    : BaseFileReader(std::move(file_p)), fs(CachingFileSystem::Get(context_p)),
      allocator(BufferAllocator::Get(context_p)), parquet_options(std::move(parquet_options_p)) {
	file_handle = fs.OpenFile(file, FileFlags::FILE_FLAGS_READ);
	if (!file_handle->CanSeek()) {
		throw NotImplementedException(
		    "Reading parquet files from a FIFO stream is not supported and cannot be efficiently supported since "
		    "metadata is located at the end of the file. Write the stream to disk first and read from there instead.");
	}

	// read the extended file open info (if any)
	optional_idx footer_size;
	if (file.extended_info) {
		auto &open_options = file.extended_info->options;
		auto encryption_entry = file.extended_info->options.find("encryption_key");
		if (encryption_entry != open_options.end()) {
			parquet_options.encryption_config =
			    make_shared_ptr<ParquetEncryptionConfig>(StringValue::Get(encryption_entry->second));
		}
		auto footer_entry = file.extended_info->options.find("footer_size");
		if (footer_entry != open_options.end()) {
			footer_size = UBigIntValue::Get(footer_entry->second);
		}
	}
	// set pointer to factory method for AES state
	auto &config = DBConfig::GetConfig(context_p);
	if (config.encryption_util && parquet_options.debug_use_openssl) {
		encryption_util = config.encryption_util;
	} else {
		encryption_util = make_shared_ptr<duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLSFactory>();
	}

	// If metadata cached is disabled
	// or if this file has cached metadata
	// or if the cached version already expired
	if (!metadata_p) {
		Value metadata_cache = false;
		context_p.TryGetCurrentSetting("parquet_metadata_cache", metadata_cache);
		if (!metadata_cache.GetValue<bool>()) {
			metadata = LoadMetadata(context_p, allocator, *file_handle, parquet_options.encryption_config,
			                        *encryption_util, footer_size);
		} else {
			auto last_modify_time = file_handle->GetLastModifiedTime();
			metadata = ObjectCache::GetObjectCache(context_p).Get<ParquetFileMetadataCache>(file.path);
			if (!metadata || (last_modify_time + 10 >= metadata->read_time)) {
				metadata = LoadMetadata(context_p, allocator, *file_handle, parquet_options.encryption_config,
				                        *encryption_util, footer_size);
				ObjectCache::GetObjectCache(context_p).Put(file.path, metadata);
			}
		}
	} else {
		metadata = std::move(metadata_p);
	}
	InitializeSchema(context_p);
}